

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

void R_AddLine(seg_t *line)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  line_t *plVar10;
  vertex_t *pvVar11;
  vertex_t *pvVar12;
  bool bVar13;
  sector_t *other;
  sector_t *this;
  short sVar14;
  short sVar15;
  short sVar16;
  short *psVar17;
  bool bVar18;
  vertex_t *pvVar19;
  int *piVar20;
  uint uVar21;
  short *psVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  DVector2 pt2;
  DVector2 pt1;
  DVector2 local_78;
  DVector2 local_68;
  DVector2 local_58;
  DVector2 local_48;
  DVector2 local_38;
  
  if (R_AddLine(seg_t*)::tempsec == '\0') {
    R_AddLine();
  }
  dVar6 = ViewPos.Y;
  dVar5 = ViewPos.X;
  dc_color = ((uint)((int)line - (int)segs) >> 3) * -0x38e38e38 & 0xff | 4;
  dVar1 = (line->v1->p).X;
  dVar2 = (line->v1->p).Y;
  local_68.X = dVar1 - ViewPos.X;
  local_68.Y = dVar2 - ViewPos.Y;
  dVar3 = (line->v2->p).X;
  dVar4 = (line->v2->p).Y;
  local_78.X = dVar3 - ViewPos.X;
  local_78.Y = dVar4 - ViewPos.Y;
  if (0.0 <= (dVar4 - dVar2) * local_68.X + (dVar1 - dVar3) * local_68.Y) {
    curline = line;
    return;
  }
  curline = line;
  bVar18 = FWallCoords::Init(&WallC,&local_68,&local_78,0.0078125);
  if (bVar18) {
    return;
  }
  if (WindowRight <= WallC.sx1) {
    return;
  }
  if (WallC.sx2 <= WindowLeft) {
    return;
  }
  if (line->linedef == (line_t *)0x0) {
    psVar17 = &solidsegs[0].last;
    do {
      psVar22 = psVar17;
      psVar17 = psVar22 + 2;
    } while (*psVar22 < WallC.sx1);
    if ((WallC.sx2 <= *psVar22) && (((cliprange_t *)(psVar22 + -1))->first <= WallC.sx1)) {
      return;
    }
  }
  else {
    if (CurrentPortal != (PortalDrawseg *)0x0 && CurrentPortalInSkybox == false) {
      local_38.X = dVar5;
      local_38.Y = dVar6;
      bVar18 = P_ClipLineToPortal(line->linedef,CurrentPortal->dst,&local_38,true,true);
      if (bVar18) {
        return;
      }
    }
    plVar10 = line->linedef;
    pvVar11 = plVar10->v1;
    pvVar12 = plVar10->v2;
    if (((pvVar11 == line->v1) && (pvVar12 == line->v2)) ||
       ((pvVar12 == line->v1 && (pvVar11 == line->v2)))) {
      FWallTmapVals::InitFromWallCoords(&WallT,&WallC);
    }
    else {
      pvVar19 = pvVar12;
      if (plVar10->sidedef[0] == line->sidedef) {
        pvVar19 = pvVar11;
        pvVar11 = pvVar12;
      }
      local_48.X = (pvVar19->p).X - ViewPos.X;
      local_48.Y = (pvVar19->p).Y - ViewPos.Y;
      local_58.X = (pvVar11->p).X - ViewPos.X;
      local_58.Y = (pvVar11->p).Y - ViewPos.Y;
      FWallTmapVals::InitFromLine(&WallT,&local_48,&local_58);
    }
    if ((fake3D & 4U) == 0) {
      backsector = line->backsector;
    }
    pvVar11 = line->v1;
    dVar1 = (frontsector->ceilingplane).D;
    dVar2 = (frontsector->ceilingplane).normal.X;
    dVar3 = (frontsector->ceilingplane).normal.Y;
    dVar4 = (pvVar11->p).Y;
    dVar5 = (frontsector->ceilingplane).negiC;
    rw_frontcz1 = (dVar4 * dVar3 + dVar1 + (pvVar11->p).X * dVar2) * dVar5;
    dVar6 = (frontsector->floorplane).D;
    dVar7 = (frontsector->floorplane).normal.X;
    dVar8 = (frontsector->floorplane).normal.Y;
    dVar9 = (frontsector->floorplane).negiC;
    rw_frontfz1 = (dVar4 * dVar8 + dVar6 + (pvVar11->p).X * dVar7) * dVar9;
    pvVar11 = line->v2;
    dVar4 = (pvVar11->p).Y;
    rw_frontcz2 = (dVar3 * dVar4 + dVar1 + dVar2 * (pvVar11->p).X) * dVar5;
    rw_frontfz2 = (dVar4 * dVar8 + dVar6 + dVar7 * (pvVar11->p).X) * dVar9;
    rw_mustmarkceiling = false;
    rw_mustmarkfloor = false;
    rw_havelow = false;
    rw_havehigh = false;
    bVar18 = true;
    if (backsector != (sector_t *)0x0) {
      if ((fake3D & 4U) == 0) {
        backsector = R_FakeFlat(backsector,&R_AddLine::tempsec,(int *)0x0,(int *)0x0,true);
      }
      doorclosed = 0;
      pvVar11 = line->v1;
      dVar1 = (backsector->ceilingplane).D;
      dVar2 = (backsector->ceilingplane).normal.X;
      dVar3 = (backsector->ceilingplane).normal.Y;
      dVar4 = (pvVar11->p).Y;
      dVar5 = (backsector->ceilingplane).negiC;
      rw_backcz1 = (dVar4 * dVar3 + dVar1 + (pvVar11->p).X * dVar2) * dVar5;
      dVar6 = (backsector->floorplane).D;
      dVar7 = (backsector->floorplane).normal.X;
      dVar8 = (backsector->floorplane).normal.Y;
      dVar9 = (backsector->floorplane).negiC;
      rw_backfz1 = (dVar4 * dVar8 + dVar6 + (pvVar11->p).X * dVar7) * dVar9;
      pvVar11 = line->v2;
      dVar4 = (pvVar11->p).Y;
      rw_backcz2 = (dVar3 * dVar4 + dVar1 + dVar2 * (pvVar11->p).X) * dVar5;
      rw_backfz2 = (dVar4 * dVar8 + dVar6 + dVar7 * (pvVar11->p).X) * dVar9;
      if ((fake3D & 4U) != 0) {
        if ((rw_backfz1 <= rw_frontfz1) && (rw_backfz2 <= rw_frontfz2)) {
          fake3D = fake3D | 8;
        }
        if ((rw_frontcz1 <= rw_backcz1) && (rw_frontcz2 <= rw_backcz2)) {
          fake3D = fake3D | 0x10;
        }
      }
      if ((rw_backcz1 < rw_frontcz1) || (rw_backcz2 < rw_frontcz2)) {
        rw_havehigh = true;
        WallMost(wallupper,&backsector->ceilingplane,&WallC);
      }
      if ((rw_frontfz1 < rw_backfz1) || (rw_frontfz2 < rw_backfz2)) {
        rw_havelow = true;
        WallMost(walllower,&backsector->floorplane,&WallC);
      }
      this = backsector;
      other = frontsector;
      uVar21 = line->linedef->portalindex;
      if (((((linePortals.Count <= uVar21) || ((linePortals.Array[uVar21].mFlags & 1) == 0)) ||
           (line->sidedef != line->linedef->sidedef[0])) &&
          ((rw_frontfz1 < rw_backcz1 || (rw_frontfz2 < rw_backcz2)))) &&
         ((rw_backfz1 < rw_frontcz1 || (rw_backfz2 < rw_frontcz2)))) {
        iVar23 = backsector->planes[1].Texture.texnum;
        if (((((iVar23 == skyflatnum.texnum) &&
              (frontsector->planes[1].Texture.texnum == skyflatnum.texnum)) ||
             (rw_backfz1 < rw_backcz1)) ||
            ((rw_backfz2 < rw_backcz2 ||
             (((rw_backcz1 < rw_frontcz1 || (rw_backcz2 < rw_frontcz2)) &&
              (line->sidedef->textures[0].texture.texnum < 1)))))) ||
           (((rw_frontfz1 < rw_backfz1 || (rw_frontfz2 < rw_backfz2)) &&
            (line->sidedef->textures[2].texture.texnum < 1)))) {
          bVar13 = true;
          if (((frontsector->ceilingplane).normal.X == (backsector->ceilingplane).normal.X) &&
             ((frontsector->ceilingplane).normal.Y == (backsector->ceilingplane).normal.Y)) {
            bVar13 = (frontsector->ceilingplane).normal.Z != (backsector->ceilingplane).normal.Z;
          }
          bVar18 = false;
          if ((!bVar13) &&
             (bVar18 = false, (frontsector->ceilingplane).D == (backsector->ceilingplane).D)) {
            bVar13 = true;
            if (((frontsector->floorplane).normal.X == (backsector->floorplane).normal.X) &&
               ((frontsector->floorplane).normal.Y == (backsector->floorplane).normal.Y)) {
              bVar13 = (frontsector->floorplane).normal.Z != (backsector->floorplane).normal.Z;
            }
            bVar18 = false;
            if ((!bVar13) && ((frontsector->floorplane).D == (backsector->floorplane).D)) {
              bVar18 = R_SkyboxCompare(frontsector,backsector);
              if (((((!bVar18) &&
                    (((this->lightlevel == other->lightlevel &&
                      (this->planes[0].Texture.texnum == other->planes[0].Texture.texnum)) &&
                     (iVar23 == other->planes[1].Texture.texnum)))) &&
                   (((curline->sidedef->textures[1].texture.texnum < 1 &&
                     (bVar18 = FTransform::operator!=((FTransform *)this,(FTransform *)other),
                     !bVar18)) &&
                    (bVar18 = FTransform::operator!=
                                        (&backsector->planes[1].xform,&frontsector->planes[1].xform)
                    , !bVar18)))) &&
                  (((backsector->planes[0].Light == frontsector->planes[0].Light &&
                    (backsector->planes[1].Light == frontsector->planes[1].Light)) &&
                   ((((frontsector->planes[0].Flags ^ backsector->planes[0].Flags) & 0xfffffecdU) ==
                     0 && ((((frontsector->planes[1].Flags ^ backsector->planes[1].Flags) &
                            0xfffffecdU) == 0 && (backsector->ColorMap == frontsector->ColorMap)))))
                   ))) && (((frontsector->e == (extsector_t *)0x0 ||
                            ((frontsector->e->XFloor).lightlist.Count == 0)) &&
                           ((backsector->e == (extsector_t *)0x0 ||
                            ((backsector->e->XFloor).lightlist.Count == 0)))))) {
                if (hasglnodes != true) {
                  return;
                }
                uVar21 = InSubsector->flags;
                if ((uVar21 & 2) != 0) {
                  return;
                }
                piVar20 = &InSubsector->flags;
                psVar17 = &solidsegs[0].last;
                do {
                  psVar22 = psVar17;
                  psVar17 = psVar22 + 2;
                } while (*psVar22 < WallC.sx1);
                if ((WallC.sx2 <= *psVar22) && (((cliprange_t *)(psVar22 + -1))->first <= WallC.sx1)
                   ) {
                  return;
                }
                goto LAB_00300828;
              }
              bVar18 = false;
            }
          }
        }
        else {
          doorclosed = 1;
        }
      }
    }
    sVar16 = (short)centery;
    sVar15 = WallC.sx2;
    sVar14 = WallC.sx1;
    rw_prepped = false;
    if (line->linedef->special == 9) {
      iVar24 = (int)WallC.sx1;
      iVar23 = (int)WallC.sx2;
      if (WallC.sx2 != WallC.sx1) {
        uVar25 = 0;
        do {
          walltop[(long)iVar24 + uVar25] = sVar16;
          uVar25 = uVar25 + 1;
        } while ((uint)(iVar23 - iVar24) != uVar25);
      }
      if (sVar15 != sVar14) {
        uVar25 = 0;
        do {
          wallbottom[(long)iVar24 + uVar25] = sVar16;
          uVar25 = uVar25 + 1;
        } while ((uint)(iVar23 - iVar24) != uVar25);
      }
    }
    else {
      rw_ceilstat = WallMost(walltop,&frontsector->ceilingplane,&WallC);
      rw_floorstat = WallMost(wallbottom,&frontsector->floorplane,&WallC);
    }
    bVar18 = R_ClipWallSegment((int)WallC.sx1,(int)WallC.sx2,bVar18);
    if (!bVar18) {
      return;
    }
  }
  uVar21 = InSubsector->flags;
  piVar20 = &InSubsector->flags;
LAB_00300828:
  *piVar20 = uVar21 | 2;
  return;
}

Assistant:

void R_AddLine (seg_t *line)
{
	static sector_t tempsec;	// killough 3/8/98: ceiling/water hack
	bool			solid;
	DVector2		pt1, pt2;

	curline = line;

	// [RH] Color if not texturing line
	dc_color = (((int)(line - segs) * 8) + 4) & 255;

	pt1 = line->v1->fPos() - ViewPos;
	pt2 = line->v2->fPos() - ViewPos;

	// Reject lines not facing viewer
	if (pt1.Y * (pt1.X - pt2.X) + pt1.X * (pt2.Y - pt1.Y) >= 0)
		return;

	if (WallC.Init(pt1, pt2, 32.0 / (1 << 12)))
		return;

	if (WallC.sx1 >= WindowRight || WallC.sx2 <= WindowLeft)
		return;

	if (line->linedef == NULL)
	{
		if (R_CheckClipWallSegment (WallC.sx1, WallC.sx2))
		{
			InSubsector->flags |= SSECF_DRAWN;
		}
		return;
	}

	// reject lines that aren't seen from the portal (if any)
	// [ZZ] 10.01.2016: lines inside a skybox shouldn't be clipped, although this imposes some limitations on portals in skyboxes.
	if (!CurrentPortalInSkybox && CurrentPortal && P_ClipLineToPortal(line->linedef, CurrentPortal->dst, ViewPos))
		return;

	vertex_t *v1, *v2;
	v1 = line->linedef->v1;
	v2 = line->linedef->v2;

	if ((v1 == line->v1 && v2 == line->v2) || (v2 == line->v1 && v1 == line->v2))
	{ // The seg is the entire wall.
		WallT.InitFromWallCoords(&WallC);
	}
	else
	{ // The seg is only part of the wall.
		if (line->linedef->sidedef[0] != line->sidedef)
		{
			swapvalues (v1, v2);
		}
		WallT.InitFromLine(v1->fPos() - ViewPos, v2->fPos() - ViewPos);
	}

	if (!(fake3D & FAKE3D_FAKEBACK))
	{
		backsector = line->backsector;
	}
	rw_frontcz1 = frontsector->ceilingplane.ZatPoint(line->v1);
	rw_frontfz1 = frontsector->floorplane.ZatPoint(line->v1);
	rw_frontcz2 = frontsector->ceilingplane.ZatPoint(line->v2);
	rw_frontfz2 = frontsector->floorplane.ZatPoint(line->v2);

	rw_mustmarkfloor = rw_mustmarkceiling = false;
	rw_havehigh = rw_havelow = false;

	// Single sided line?
	if (backsector == NULL)
	{
		solid = true;
	}
	else
	{
		// kg3D - its fake, no transfer_heights
		if (!(fake3D & FAKE3D_FAKEBACK))
		{ // killough 3/8/98, 4/4/98: hack for invisible ceilings / deep water
			backsector = R_FakeFlat (backsector, &tempsec, NULL, NULL, true);
		}
		doorclosed = 0;		// killough 4/16/98

		rw_backcz1 = backsector->ceilingplane.ZatPoint(line->v1);
		rw_backfz1 = backsector->floorplane.ZatPoint(line->v1);
		rw_backcz2 = backsector->ceilingplane.ZatPoint(line->v2);
		rw_backfz2 = backsector->floorplane.ZatPoint(line->v2);

		if (fake3D & FAKE3D_FAKEBACK)
		{
			if (rw_frontfz1 >= rw_backfz1 && rw_frontfz2 >= rw_backfz2)
			{
				fake3D |= FAKE3D_CLIPBOTFRONT;
			}
			if (rw_frontcz1 <= rw_backcz1 && rw_frontcz2 <= rw_backcz2)
			{
				fake3D |= FAKE3D_CLIPTOPFRONT;
			}
		}

		// Cannot make these walls solid, because it can result in
		// sprite clipping problems for sprites near the wall
		if (rw_frontcz1 > rw_backcz1 || rw_frontcz2 > rw_backcz2)
		{
			rw_havehigh = true;
			WallMost (wallupper, backsector->ceilingplane, &WallC);
		}
		if (rw_frontfz1 < rw_backfz1 || rw_frontfz2 < rw_backfz2)
		{
			rw_havelow = true;
			WallMost (walllower, backsector->floorplane, &WallC);
		}

		// Portal
		if (line->linedef->isVisualPortal() && line->sidedef == line->linedef->sidedef[0])
		{
			solid = true;
		}
		// Closed door.
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			solid = true;
		}
		else if (
		// properly render skies (consider door "open" if both ceilings are sky):
		(backsector->GetTexture(sector_t::ceiling) != skyflatnum || frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

		// if door is closed because back is shut:
		&& rw_backcz1 <= rw_backfz1 && rw_backcz2 <= rw_backfz2

		// preserve a kind of transparent door/lift special effect:
		&& ((rw_backcz1 >= rw_frontcz1 && rw_backcz2 >= rw_frontcz2) || line->sidedef->GetTexture(side_t::top).isValid())
		&& ((rw_backfz1 <= rw_frontfz1 && rw_backfz2 <= rw_frontfz2) || line->sidedef->GetTexture(side_t::bottom).isValid()))
		{
		// killough 1/18/98 -- This function is used to fix the automap bug which
		// showed lines behind closed doors simply because the door had a dropoff.
		//
		// It assumes that Doom has already ruled out a door being closed because
		// of front-back closure (e.g. front floor is taller than back ceiling).

		// This fixes the automap floor height bug -- killough 1/18/98:
		// killough 4/7/98: optimize: save result in doorclosed for use in r_segs.c
			doorclosed = true;
			solid = true;
		}
		else if (frontsector->ceilingplane != backsector->ceilingplane ||
			frontsector->floorplane != backsector->floorplane)
		{
		// Window.
			solid = false;
		}
		else if (R_SkyboxCompare(frontsector, backsector))
		{
			solid = false;
		}
		else if (backsector->lightlevel != frontsector->lightlevel
			|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
			|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)
			|| curline->sidedef->GetTexture(side_t::mid).isValid()

			// killough 3/7/98: Take flats offsets into account:
			|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
			|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform

			|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)
			|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
			|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)
			|| backsector->GetVisFlags(sector_t::ceiling) != frontsector->GetVisFlags(sector_t::ceiling)

			// [RH] Also consider colormaps
			|| backsector->ColorMap != frontsector->ColorMap



			// kg3D - and fake lights
			|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
			|| (backsector->e && backsector->e->XFloor.lightlist.Size())
			)
		{
			solid = false;
		}
		else
		{
			// Reject empty lines used for triggers and special events.
			// Identical floor and ceiling on both sides, identical light levels
			// on both sides, and no middle texture.

			// When using GL nodes, do a clipping test for these lines so we can
			// mark their subsectors as visible for automap texturing.
			if (hasglnodes && !(InSubsector->flags & SSECF_DRAWN))
			{
				if (R_CheckClipWallSegment(WallC.sx1, WallC.sx2))
				{
					InSubsector->flags |= SSECF_DRAWN;
				}
			}
			return;
		}
	}

	rw_prepped = false;

	if (line->linedef->special == Line_Horizon)
	{
		// Be aware: Line_Horizon does not work properly with sloped planes
		clearbufshort (walltop+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
		clearbufshort (wallbottom+WallC.sx1, WallC.sx2 - WallC.sx1, centery);
	}
	else
	{
		rw_ceilstat = WallMost (walltop, frontsector->ceilingplane, &WallC);
		rw_floorstat = WallMost (wallbottom, frontsector->floorplane, &WallC);

		// [RH] treat off-screen walls as solid
#if 0	// Maybe later...
		if (!solid)
		{
			if (rw_ceilstat == 12 && line->sidedef->GetTexture(side_t::top) != 0)
			{
				rw_mustmarkceiling = true;
				solid = true;
			}
			if (rw_floorstat == 3 && line->sidedef->GetTexture(side_t::bottom) != 0)
			{
				rw_mustmarkfloor = true;
				solid = true;
			}
		}
#endif
	}

	if (R_ClipWallSegment (WallC.sx1, WallC.sx2, solid))
	{
		InSubsector->flags |= SSECF_DRAWN;
	}
}